

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

long ov_read_float(OggVorbis_File *vf,float ***pcm_channels,int length,int *bitstream)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar4;
  int extraout_EDX_01;
  long lVar5;
  float **pcm;
  float **local_38;
  
  lVar5 = -0x83;
  if (1 < vf->ready_state) {
    piVar3 = bitstream;
    iVar4 = length;
    do {
      if (vf->ready_state == 4) {
        iVar1 = vorbis_synthesis_pcmout(&vf->vd,&local_38);
        iVar4 = extraout_EDX;
        if (iVar1 != 0) {
          uVar2 = vorbis_synthesis_halfrate_p(vf->vi);
          if (pcm_channels != (float ***)0x0) {
            *pcm_channels = local_38;
          }
          iVar4 = length;
          if (iVar1 < length) {
            iVar4 = iVar1;
          }
          lVar5 = (long)iVar4;
          vorbis_synthesis_read(&vf->vd,iVar4);
          piVar3 = (int *)(ulong)uVar2;
          vf->pcm_offset = vf->pcm_offset + (lVar5 << ((byte)uVar2 & 0x3f));
          iVar4 = extraout_EDX_00;
          if (bitstream != (int *)0x0) {
            *bitstream = vf->current_link;
          }
        }
        if (iVar1 != 0) {
          return lVar5;
        }
      }
      iVar1 = _fetch_and_process_packet(vf,(ogg_packet *)0x1,iVar4,(int)piVar3);
      if (iVar1 < 1) {
        lVar5 = (long)iVar1;
      }
      if (iVar1 == -2) {
        lVar5 = 0;
      }
      iVar4 = extraout_EDX_01;
    } while (0 < iVar1);
  }
  return lVar5;
}

Assistant:

long ov_read_float(OggVorbis_File *vf,float ***pcm_channels,int length,
                   int *bitstream){

  if(vf->ready_state<OPENED)return(OV_EINVAL);

  while(1){
    if(vf->ready_state==INITSET){
      float **pcm;
      long samples=vorbis_synthesis_pcmout(&vf->vd,&pcm);
      if(samples){
        int hs=vorbis_synthesis_halfrate_p(vf->vi);
        if(pcm_channels)*pcm_channels=pcm;
        if(samples>length)samples=length;
        vorbis_synthesis_read(&vf->vd,samples);
        vf->pcm_offset+=samples<<hs;
        if(bitstream)*bitstream=vf->current_link;
        return samples;

      }
    }

    /* suck in another packet */
    {
      int ret=_fetch_and_process_packet(vf,NULL,1,1);
      if(ret==OV_EOF)return(0);
      if(ret<=0)return(ret);
    }

  }
}